

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferData(ErrorsTest *this)

{
  ErrorsTest *pEVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  uint *puVar10;
  _Elt_pointer puVar11;
  undefined4 *puVar12;
  GLuint not_a_buffer_name;
  GLuint GVar13;
  undefined4 uVar14;
  ulong uVar15;
  GLuint immutable_buffer;
  GLubyte dummy_data [4];
  GLuint buffer;
  ErrorsTest *local_220;
  undefined4 local_214;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> too_much_buffers;
  Enum<int,_2UL> local_1c0;
  GLenum invalid_usage;
  uint uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar9;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  buffer = 0;
  immutable_buffer = 0;
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&too_much_buffers);
  (**(code **)(lVar9 + 0x3b8))(1,&buffer);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1159);
  (**(code **)(lVar9 + 0x3b8))(1,&immutable_buffer);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115c);
  (*this->m_pNamedBufferStorage)(immutable_buffer,4,dummy_data,1);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x115f);
  GVar13 = 0;
  do {
    GVar13 = GVar13 + 1;
    cVar2 = (**(code **)(lVar9 + 0xc68))(GVar13);
  } while (cVar2 != '\0');
  (*this->m_pNamedBufferData)(GVar13,4,dummy_data,0x88ea);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  uVar15 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
  _invalid_usage = (TestLog *)((ulong)uStack_1ac << 0x20);
  local_220 = this;
  do {
    _invalid_usage = (TestLog *)CONCAT44(uStack_1ac,invalid_usage + 1);
    puVar10 = std::
              __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        (TestErrorsOfNamedBufferData::valid_usages,0x170a764,&invalid_usage);
    pEVar1 = local_220;
  } while (puVar10 != TestErrorsOfNamedBufferData::valid_usages + 9);
  (*local_220->m_pNamedBufferData)(buffer,4,dummy_data,invalid_usage);
  bVar3 = ErrorCheckAndLog(pEVar1,"glNamedBufferData",0x500,
                           " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ, STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY."
                          );
  (*pEVar1->m_pNamedBufferData)(buffer,-1,dummy_data,0x88ea);
  bVar4 = ErrorCheckAndLog(pEVar1,"glNamedBufferData",0x501," if size is negative.");
  (*pEVar1->m_pNamedBufferData)(immutable_buffer,2,dummy_data,0x88ea);
  bVar5 = ErrorCheckAndLog(pEVar1,"glNamedBufferData",0x502,
                           " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
  local_214 = (undefined4)CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 & bVar3 & bVar4 & bVar5);
  iVar6 = 0x100;
  do {
    bVar3 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar3) {
      _invalid_usage = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "Test of NamedBufferData out of memory negative behavior failed to generate erroneous situation. Direct State Access Buffers Test\'s MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or the driver implementation does not inform about out of memory problem."
                     );
      uVar14 = local_214;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&invalid_usage,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      goto LAB_00af1f83;
    }
    _invalid_usage = (TestLog *)((ulong)_invalid_usage & 0xffffffff00000000);
    (**(code **)(lVar9 + 0x3b8))(1,&invalid_usage);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x11ad);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&too_much_buffers.c,&invalid_usage);
    (*local_220->m_pNamedBufferData)(invalid_usage,0x7fffffffffffffff,(GLvoid *)0x0,0x88ea);
    iVar8 = (**(code **)(lVar9 + 0x800))();
  } while (iVar8 == 0);
  uVar14 = local_214;
  if (iVar8 != 0x505) {
    _invalid_usage = ((local_220->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "NamedBufferData does not generate OUT_OF_MEMORY error if the GL is unable to create a data store with the specified size."
                   );
    std::operator<<((ostream *)local_1a8,"The error value of ");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar8;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)local_1a8);
    std::operator<<((ostream *)local_1a8," was observed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&invalid_usage,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    uVar14 = 0;
  }
LAB_00af1f83:
  if (buffer != 0) {
    (**(code **)(lVar9 + 0x438))(1,&buffer);
    buffer = 0;
  }
  local_220 = (ErrorsTest *)((ulong)local_220 & 0xffffffff00000000);
  while (pEVar1 = local_220,
        too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    puVar11 = too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      puVar11 = too_much_buffers.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    _invalid_usage = (TestLog *)CONCAT44(uStack_1ac,puVar11[-1]);
    if (puVar11[-1] != 0) {
      (**(code **)(lVar9 + 0x438))(1,&invalid_usage);
    }
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&too_much_buffers.c);
  }
  if (immutable_buffer != 0) {
    (**(code **)(lVar9 + 0x438))(1,&immutable_buffer);
    immutable_buffer = 0;
  }
  if ((char)pEVar1 != '\0') {
    puVar12 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar12 = 0;
    __cxa_throw(puVar12,&int::typeinfo,0);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&too_much_buffers);
  return SUB41(uVar14,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint				buffer			 = 0;
	glw::GLuint				immutable_buffer = 0;
	glw::GLubyte			dummy_data[4]	= {};
	std::stack<glw::GLuint> too_much_buffers;

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		gl.createBuffers(1, &immutable_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(immutable_buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferData(not_a_buffer_name, sizeof(dummy_data), dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test invalid usage error behavior. */
		{
			/* Prepare for invalid type error behavior verification. */
			static const glw::GLenum valid_usages[] = { GL_STREAM_DRAW,  GL_STREAM_READ,  GL_STREAM_COPY,
														GL_STATIC_DRAW,  GL_STATIC_READ,  GL_STATIC_COPY,
														GL_DYNAMIC_DRAW, GL_DYNAMIC_READ, GL_DYNAMIC_COPY,
														GL_NONE };
			static const glw::GLenum valid_usages_last = sizeof(valid_usages) / sizeof(valid_usages[0]) - 1;

			glw::GLenum invalid_usage = 0;

			while (&valid_usages[valid_usages_last] !=
				   std::find(&valid_usages[0], &valid_usages[valid_usages_last], (++invalid_usage)))
				;

			/* Test. */
			m_pNamedBufferData(buffer, sizeof(dummy_data), dummy_data, invalid_usage);

			is_ok &=
				ErrorCheckAndLog("glNamedBufferData", GL_INVALID_ENUM,
								 " if usage is not STREAM_DRAW, STREAM_READ, STREAM_COPY, STATIC_DRAW, STATIC_READ,"
								 " STATIC_COPY, DYNAMIC_DRAW, DYNAMIC_READ or DYNAMIC_COPY.");
		}

		/* Test negative size error behavior. */
		{
			m_pNamedBufferData(buffer, -1, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_VALUE, " if size is negative.");
		}

		/* Test immutable buffer error behavior. */
		{
			m_pNamedBufferData(immutable_buffer, sizeof(dummy_data) / 2, dummy_data, GL_DYNAMIC_COPY);

			is_ok &= ErrorCheckAndLog("glNamedBufferData", GL_INVALID_OPERATION,
									  " if the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE.");
		}

		/* Test out of memory error behavior. */
		{
			/* Calculate maximum buffer size (depending on number of bits of function argument). */
			glw::GLsizei max_pointer_unsigned_bits =
				(CHAR_BIT * sizeof(glw::GLsizeiptr) - 1) /* do not include possible sign bit */;
			glw::GLsizeiptr max_possible_size = 0;

			for (glw::GLsizei i = 0; i < max_pointer_unsigned_bits; ++i)
			{
				max_possible_size |= ((glw::GLsizeiptr)1 << i);
			}

			/* Error storing variable. */
			glw::GLenum error = GL_NO_ERROR;

			/* Try to overflow by allocating biggest possible buffers in a loop. */
			for (glw::GLuint i = 0; i < MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR; ++i)
			{
				/* New big buffer creation. */
				glw::GLuint tmp_buffer = 0;

				gl.createBuffers(1, &tmp_buffer);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				/* Add it to delete list. */
				too_much_buffers.push(tmp_buffer);

				/* Try to allocate big buffer storage. */
				m_pNamedBufferData(tmp_buffer, max_possible_size, DE_NULL, GL_DYNAMIC_COPY);

				/* Check for errors. */
				error = gl.getError();

				if (error != GL_NO_ERROR)
				{
					break;
				}
			}

			if (error == GL_NO_ERROR)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Test of NamedBufferData out of memory negative behavior failed to "
												"generate erroneous situation. "
												"Direct State Access Buffers Test's "
												"MAX_NUMBER_OF_TRIES_TO_GENERATE_OUT_OF_MEMORY_ERROR is too small or "
												"the driver implementation does not inform about out of memory problem."
					<< tcu::TestLog::EndMessage;
			}
			else
			{
				if (error != GL_OUT_OF_MEMORY)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "NamedBufferData does not generate OUT_OF_MEMORY error if the GL "
													"is unable to create a data store with the specified size."
						<< "The error value of " << glu::getErrorStr(error) << " was observed."
						<< tcu::TestLog::EndMessage;

					is_ok = false;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	while (!too_much_buffers.empty())
	{
		glw::GLuint tmp_buffer = too_much_buffers.top();

		if (tmp_buffer)
		{
			gl.deleteBuffers(1, &tmp_buffer);
		}

		too_much_buffers.pop();
	}

	if (immutable_buffer)
	{
		gl.deleteBuffers(1, &immutable_buffer);

		immutable_buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}